

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuttongroup.cpp
# Opt level: O0

int __thiscall QButtonGroup::checkedId(QButtonGroup *this)

{
  long lVar1;
  int iVar2;
  QButtonGroupPrivate *this_00;
  long in_FS_OFFSET;
  QButtonGroupPrivate *d;
  QHash<QAbstractButton_*,_int> *defaultValue;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QButtonGroup *)0x510535);
  defaultValue = &this_00->mapping;
  ::QPointer::operator_cast_to_QAbstractButton_((QPointer<QAbstractButton> *)0x510558);
  iVar2 = QHash<QAbstractButton_*,_int>::value
                    ((QHash<QAbstractButton_*,_int> *)this_00,
                     (QAbstractButton **)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (int *)defaultValue);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QButtonGroup::checkedId() const
{
    Q_D(const QButtonGroup);
    return d->mapping.value(d->checkedButton, -1);
}